

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O0

unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> __thiscall
spvtools::opt::InstrumentPass::NewName(InstrumentPass *this,uint32_t id,string *name_str)

{
  initializer_list<unsigned_int> init_list;
  __uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
  in_RCX;
  undefined4 in_register_00000034;
  Operand *local_138;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_130;
  SmallVector<unsigned_int,_2UL> local_118;
  uint local_ec;
  iterator local_e8;
  undefined8 local_e0;
  SmallVector<unsigned_int,_2UL> local_d8;
  Operand local_b0;
  Operand OStack_80;
  Operand local_50;
  string *name_str_local;
  Pass *pPStack_18;
  uint32_t id_local;
  InstrumentPass *this_local;
  
  pPStack_18 = (Pass *)CONCAT44(in_register_00000034,id);
  name_str_local._4_4_ = (uint)name_str;
  local_50.words.large_data_._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )in_RCX.
                     super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     ._M_head_impl;
  this_local = this;
  local_50.words.small_data_ = (uint *)Pass::context(pPStack_18);
  local_50.words.buffer[1].data._M_elems = (array<signed_char,_4UL>)(_Type)0x5;
  local_50.words.buffer[0].data._M_elems = (array<signed_char,_4UL>)(_Type)0x0;
  local_50.words.size_._4_4_ = 0;
  local_ec = name_str_local._4_4_;
  local_e8 = &local_ec;
  local_e0 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_e8;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_d8,init_list);
  Operand::Operand(&local_b0,SPV_OPERAND_TYPE_ID,&local_d8);
  utils::MakeVector(&local_130,
                    (string *)
                    local_50.words.large_data_._M_t.
                    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    .
                    super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                    ._M_head_impl);
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_118,&local_130);
  Operand::Operand(&OStack_80,SPV_OPERAND_TYPE_LITERAL_STRING,&local_118);
  local_50._0_8_ = &local_b0;
  local_50.words._vptr_SmallVector = (_func_int **)0x2;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)this,(IRContext **)&local_50.words.small_data_,
             (Op *)(local_50.words.buffer + 1),(int *)local_50.words.buffer,
             (int *)((long)&local_50.words.size_ + 4),
             (initializer_list<spvtools::opt::Operand> *)&local_50);
  local_138 = &local_50;
  do {
    local_138 = local_138 + -1;
    Operand::~Operand(local_138);
  } while (local_138 != &local_b0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_118);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_130);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_d8);
  return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Instruction> InstrumentPass::NewName(
    uint32_t id, const std::string& name_str) {
  return MakeUnique<Instruction>(
      context(), spv::Op::OpName, 0, 0,
      std::initializer_list<Operand>{
          {SPV_OPERAND_TYPE_ID, {id}},
          {SPV_OPERAND_TYPE_LITERAL_STRING, utils::MakeVector(name_str)}});
}